

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# opennurbs_3dm_settings.cpp
# Opt level: O2

bool __thiscall ON_3dmIOSettings::Write(ON_3dmIOSettings *this,ON_BinaryArchive *file)

{
  bool bVar1;
  bool bVar2;
  int iVar3;
  uint i;
  
  bVar2 = false;
  bVar1 = ON_BinaryArchive::BeginWrite3dmChunk(file,0x40008000,1,0);
  if (bVar1) {
    bVar1 = ON_BinaryArchive::WriteBool(file,this->m_bSaveTextureBitmapsInFile);
    if (bVar1) {
      i = this->m_idef_link_update;
      if (i == 0) {
        iVar3 = ON_BinaryArchive::Archive3dmVersion(file);
        i = (uint)(4 < iVar3);
      }
      bVar1 = ON_BinaryArchive::WriteInt(file,i);
    }
    else {
      bVar1 = false;
    }
    bVar2 = ON_BinaryArchive::EndWrite3dmChunk(file);
    bVar2 = (bool)(bVar2 & bVar1);
  }
  return bVar2;
}

Assistant:

bool ON_3dmIOSettings::Write(ON_BinaryArchive& file) const
{
  bool rc = file.BeginWrite3dmChunk(TCODE_ANONYMOUS_CHUNK,1,0);
  if (!rc)
    return false;
  for(;;)
  {
    rc = file.WriteBool(m_bSaveTextureBitmapsInFile);
    if(!rc) break;

    int i = m_idef_link_update;
    if ( 0 == i && file.Archive3dmVersion() >= 5 )
    {
      // 7 February 2011 - old 0 value is no longer an option.
      i = 1;
    }
    rc = file.WriteInt(i);
    if(!rc) break;

    break;
  }
  if ( !file.EndWrite3dmChunk() )
    rc = false;

  return rc;
}